

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PxVector.h
# Opt level: O1

void __thiscall
hacd::vector<HACD::HACD_API::Hull>::recreate(vector<HACD::HACD_API::Hull> *this,HaU32 capacity)

{
  uint uVar1;
  Hull *__ptr;
  HaF32 *pHVar2;
  HaU32 HVar3;
  Hull *pHVar4;
  Hull *pHVar5;
  Hull *pHVar6;
  
  if (capacity == 0) {
    pHVar4 = (Hull *)0x0;
  }
  else {
    pHVar4 = (Hull *)malloc((ulong)capacity * 0x18);
    if ((pHVar4 == (Hull *)0x0) || (pHVar4 == this->mData)) {
      __assert_fail("!capacity || newData && newData != mData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                    ,0x23b,
                    "void hacd::vector<HACD::HACD_API::Hull>::recreate(HaU32) [T = HACD::HACD_API::Hull]"
                   );
    }
  }
  uVar1 = this->mSize;
  __ptr = this->mData;
  if ((ulong)uVar1 != 0) {
    pHVar5 = __ptr;
    pHVar6 = pHVar4;
    do {
      pHVar6->mIndices = pHVar5->mIndices;
      HVar3 = pHVar5->mVertexCount;
      pHVar2 = pHVar5->mVertices;
      pHVar6->mTriangleCount = pHVar5->mTriangleCount;
      pHVar6->mVertexCount = HVar3;
      pHVar6->mVertices = pHVar2;
      pHVar6 = pHVar6 + 1;
      pHVar5 = pHVar5 + 1;
    } while (pHVar6 < pHVar4 + uVar1);
  }
  if (-1 < (int)this->mCapacity) {
    free(__ptr);
  }
  this->mData = pHVar4;
  this->mCapacity = capacity;
  return;
}

Assistant:

HACD_NOINLINE void vector<T>::recreate(HaU32 capacity)
	{
		T* newData = allocate(capacity);
		HACD_ASSERT(!capacity || newData && newData != mData);

		copy(newData, newData + mSize, mData);
		destroy(mData, mData + mSize);
		if(!isInUserMemory())
			deallocate(mData);

		mData = newData;
		mCapacity = capacity;
	}